

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

FT_Error TT_Load_Simple_Glyph(TT_Loader load)

{
  FT_Byte FVar1;
  byte bVar2;
  short *psVar3;
  byte *pbVar4;
  FT_Byte *pFVar5;
  FT_Vector *pFVar6;
  FT_Byte *pFVar7;
  int local_cc;
  int local_c8;
  ulong uStack_c0;
  FT_Byte f_1;
  FT_Pos delta_1;
  ulong uStack_b0;
  FT_Byte f;
  FT_Pos delta;
  FT_ULong tmp;
  FT_Int xy_size;
  FT_Short prev_cont;
  FT_Short *cont_limit;
  FT_Short *cont;
  FT_Pos y;
  FT_Pos x;
  FT_Vector *vec_limit;
  FT_Vector *vec;
  FT_Byte count;
  FT_Byte c;
  FT_Byte *flag_limit;
  FT_Byte *flag;
  FT_Int n_points;
  FT_UShort n_ins;
  FT_Outline *outline;
  FT_GlyphLoader pFStack_38;
  FT_Int n_contours;
  FT_GlyphLoader gloader;
  FT_Byte *limit;
  FT_Byte *p;
  TT_Loader pTStack_18;
  FT_Error error;
  TT_Loader load_local;
  
  limit = load->cursor;
  gloader = (FT_GlyphLoader)load->limit;
  pFStack_38 = load->gloader;
  outline._4_4_ = (FT_UInt)load->n_contours;
  tmp._0_4_ = 0;
  pTStack_18 = load;
  if ((outline._4_4_ == 0) ||
     ((int)(pFStack_38->base).outline.n_contours + (int)(pFStack_38->current).outline.n_contours +
      outline._4_4_ <= pFStack_38->max_contours)) {
    local_c8 = 0;
  }
  else {
    local_c8 = FT_GlyphLoader_CheckPoints(pFStack_38,0,outline._4_4_);
  }
  p._4_4_ = local_c8;
  if (local_c8 != 0) {
    return local_c8;
  }
  psVar3 = (pFStack_38->current).outline.contours;
  _xy_size = psVar3 + (int)outline._4_4_;
  if (((int)outline._4_4_ < 0xfff) &&
     ((FT_GlyphLoader)(limit + (int)((outline._4_4_ + 1) * 2)) <= gloader)) {
    FVar1 = *limit;
    tmp._6_2_ = CONCAT11(FVar1,limit[1]);
    if (0 < (int)outline._4_4_) {
      *psVar3 = tmp._6_2_;
    }
    pFVar5 = limit;
    if (-1 < (char)FVar1) {
      while( true ) {
        limit = pFVar5 + 2;
        cont_limit = psVar3 + 1;
        if (_xy_size <= cont_limit) break;
        *cont_limit = CONCAT11(*limit,pFVar5[3]);
        if (*cont_limit <= tmp._6_2_) {
          return 0x14;
        }
        tmp._6_2_ = *cont_limit;
        psVar3 = cont_limit;
        pFVar5 = limit;
      }
      flag._0_4_ = 0;
      if (((int)outline._4_4_ < 1) || (flag._0_4_ = *psVar3 + 1, -1 < (int)flag)) {
        if (((int)flag == -4) ||
           ((uint)((int)(pFStack_38->base).outline.n_points +
                   (int)(pFStack_38->current).outline.n_points + (int)flag + 4) <=
            pFStack_38->max_points)) {
          local_cc = 0;
        }
        else {
          local_cc = FT_GlyphLoader_CheckPoints(pFStack_38,(int)flag + 4,0);
        }
        p._4_4_ = local_cc;
        if (local_cc != 0) {
          return local_cc;
        }
        pTStack_18->glyph->control_len = 0;
        pTStack_18->glyph->control_data = (void *)0x0;
        if ((FT_GlyphLoader)(limit + 2) <= gloader) {
          pFVar5 = limit + 2;
          flag._6_2_ = CONCAT11(*limit,limit[1]);
          limit = pFVar5;
          if ((pTStack_18->load_flags & 2) == 0) {
            if ((long)gloader - (long)pFVar5 < (long)(ulong)flag._6_2_) {
              return 0x16;
            }
            delta = (FT_Pos)pTStack_18->exec->glyphSize;
            p._4_4_ = Update_Max(pTStack_18->exec->memory,(FT_ULong *)&delta,1,
                                 &pTStack_18->exec->glyphIns,(ulong)flag._6_2_);
            pTStack_18->exec->glyphSize = (FT_UInt)delta;
            if (p._4_4_ != 0) {
              return p._4_4_;
            }
            pTStack_18->glyph->control_len = (ulong)flag._6_2_;
            pTStack_18->glyph->control_data = pTStack_18->exec->glyphIns;
            if (flag._6_2_ != 0) {
              memcpy(pTStack_18->exec->glyphIns,limit,(ulong)flag._6_2_);
            }
          }
          flag_limit = (FT_Byte *)(pFStack_38->current).outline.tags;
          pFVar5 = flag_limit + (int)flag;
          pbVar4 = limit + (int)(uint)flag._6_2_;
          while (limit = pbVar4, flag_limit < pFVar5) {
            if (gloader < (FT_GlyphLoader)(limit + 1)) {
              return 0x14;
            }
            bVar2 = *limit;
            pFVar7 = flag_limit + 1;
            *flag_limit = bVar2;
            flag_limit = pFVar7;
            pbVar4 = limit + 1;
            if ((bVar2 & 8) != 0) {
              if (gloader < (FT_GlyphLoader)(limit + 2)) {
                return 0x14;
              }
              vec._6_1_ = limit[1];
              if (pFVar5 < pFVar7 + (int)(uint)vec._6_1_) {
                return 0x14;
              }
              for (; pbVar4 = limit + 2, vec._6_1_ != 0; vec._6_1_ = vec._6_1_ - 1) {
                *flag_limit = bVar2;
                flag_limit = flag_limit + 1;
              }
            }
          }
          if (((int)flag != 0) && ((*(pFStack_38->current).outline.tags & 0x40U) != 0)) {
            (pFStack_38->base).outline.flags = (pFStack_38->base).outline.flags | 0x40;
          }
          vec_limit = (pFStack_38->current).outline.points;
          pFVar6 = vec_limit + (int)flag;
          flag_limit = (FT_Byte *)(pFStack_38->current).outline.tags;
          y = 0;
          if ((FT_GlyphLoader)(limit + (int)tmp) <= gloader) {
            for (; vec_limit < pFVar6; vec_limit = vec_limit + 1) {
              uStack_b0 = 0;
              bVar2 = *flag_limit;
              if ((bVar2 & 2) == 0) {
                if ((bVar2 & 0x10) == 0) {
                  if (gloader < (FT_GlyphLoader)(limit + 2)) {
                    return 0x14;
                  }
                  uStack_b0 = (ulong)CONCAT11(*limit,limit[1]);
                  limit = limit + 2;
                }
              }
              else {
                if (gloader < (FT_GlyphLoader)(limit + 1)) {
                  return 0x14;
                }
                pFVar5 = limit + 1;
                uStack_b0 = (ulong)*limit;
                limit = pFVar5;
                if ((bVar2 & 0x10) == 0) {
                  uStack_b0 = -uStack_b0;
                }
              }
              y = uStack_b0 + y;
              vec_limit->x = y;
              flag_limit = flag_limit + 1;
            }
            vec_limit = (pFStack_38->current).outline.points;
            pFVar6 = vec_limit + (int)flag;
            flag_limit = (FT_Byte *)(pFStack_38->current).outline.tags;
            cont = (FT_Short *)0x0;
            do {
              if (pFVar6 <= vec_limit) {
                (pFStack_38->current).outline.n_points = (short)(int)flag;
                (pFStack_38->current).outline.n_contours = (short)outline._4_4_;
                pTStack_18->cursor = limit;
                return p._4_4_;
              }
              uStack_c0 = 0;
              bVar2 = *flag_limit;
              if ((bVar2 & 4) == 0) {
                if ((bVar2 & 0x20) == 0) {
                  if (gloader < (FT_GlyphLoader)(limit + 2)) {
                    return 0x14;
                  }
                  uStack_c0 = (ulong)CONCAT11(*limit,limit[1]);
                  limit = limit + 2;
                }
              }
              else {
                if (gloader < (FT_GlyphLoader)(limit + 1)) {
                  return 0x14;
                }
                pFVar5 = limit + 1;
                uStack_c0 = (ulong)*limit;
                limit = pFVar5;
                if ((bVar2 & 0x20) == 0) {
                  uStack_c0 = -uStack_c0;
                }
              }
              cont = (FT_Short *)(uStack_c0 + (long)cont);
              vec_limit->y = (FT_Pos)cont;
              *flag_limit = bVar2 & 1;
              vec_limit = vec_limit + 1;
              flag_limit = flag_limit + 1;
            } while( true );
          }
        }
      }
    }
  }
  return 0x14;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Simple_Glyph( TT_Loader  load )
  {
    FT_Error        error;
    FT_Byte*        p          = load->cursor;
    FT_Byte*        limit      = load->limit;
    FT_GlyphLoader  gloader    = load->gloader;
    FT_Int          n_contours = load->n_contours;
    FT_Outline*     outline;
    FT_UShort       n_ins;
    FT_Int          n_points;

    FT_Byte         *flag, *flag_limit;
    FT_Byte         c, count;
    FT_Vector       *vec, *vec_limit;
    FT_Pos          x, y;
    FT_Short        *cont, *cont_limit, prev_cont;
    FT_Int          xy_size = 0;


    /* check that we can add the contours to the glyph */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, 0, n_contours );
    if ( error )
      goto Fail;

    /* reading the contours' endpoints & number of points */
    cont       = gloader->current.outline.contours;
    cont_limit = cont + n_contours;

    /* check space for contours array + instructions count */
    if ( n_contours >= 0xFFF || p + ( n_contours + 1 ) * 2 > limit )
      goto Invalid_Outline;

    prev_cont = FT_NEXT_SHORT( p );

    if ( n_contours > 0 )
      cont[0] = prev_cont;

    if ( prev_cont < 0 )
      goto Invalid_Outline;

    for ( cont++; cont < cont_limit; cont++ )
    {
      cont[0] = FT_NEXT_SHORT( p );
      if ( cont[0] <= prev_cont )
      {
        /* unordered contours: this is invalid */
        goto Invalid_Outline;
      }
      prev_cont = cont[0];
    }

    n_points = 0;
    if ( n_contours > 0 )
    {
      n_points = cont[-1] + 1;
      if ( n_points < 0 )
        goto Invalid_Outline;
    }

    FT_TRACE5(( "  # of points: %d\n", n_points ));

    /* note that we will add four phantom points later */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, n_points + 4, 0 );
    if ( error )
      goto Fail;

    /* reading the bytecode instructions */
    load->glyph->control_len  = 0;
    load->glyph->control_data = NULL;

    if ( p + 2 > limit )
      goto Invalid_Outline;

    n_ins = FT_NEXT_USHORT( p );

    FT_TRACE5(( "  Instructions size: %u\n", n_ins ));

#ifdef TT_USE_BYTECODE_INTERPRETER

    if ( IS_HINTED( load->load_flags ) )
    {
      FT_ULong  tmp;


      /* check instructions size */
      if ( ( limit - p ) < n_ins )
      {
        FT_TRACE1(( "TT_Load_Simple_Glyph: instruction count mismatch\n" ));
        error = FT_THROW( Too_Many_Hints );
        goto Fail;
      }

      /* we don't trust `maxSizeOfInstructions' in the `maxp' table */
      /* and thus update the bytecode array size by ourselves       */

      tmp   = load->exec->glyphSize;
      error = Update_Max( load->exec->memory,
                          &tmp,
                          sizeof ( FT_Byte ),
                          (void*)&load->exec->glyphIns,
                          n_ins );

      load->exec->glyphSize = (FT_UInt)tmp;
      if ( error )
        return error;

      load->glyph->control_len  = n_ins;
      load->glyph->control_data = load->exec->glyphIns;

      if ( n_ins )
        FT_MEM_COPY( load->exec->glyphIns, p, (FT_Long)n_ins );
    }

#endif /* TT_USE_BYTECODE_INTERPRETER */

    p += n_ins;

    outline = &gloader->current.outline;

    /* reading the point tags */
    flag       = (FT_Byte*)outline->tags;
    flag_limit = flag + n_points;

    FT_ASSERT( flag );

    while ( flag < flag_limit )
    {
      if ( p + 1 > limit )
        goto Invalid_Outline;

      *flag++ = c = FT_NEXT_BYTE( p );
      if ( c & REPEAT_FLAG )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        count = FT_NEXT_BYTE( p );
        if ( flag + (FT_Int)count > flag_limit )
          goto Invalid_Outline;

        for ( ; count > 0; count-- )
          *flag++ = c;
      }
    }

    /* retain the overlap flag */
    if ( n_points && outline->tags[0] & OVERLAP_SIMPLE )
      gloader->base.outline.flags |= FT_OUTLINE_OVERLAP;

    /* reading the X coordinates */

    vec       = outline->points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    x         = 0;

    if ( p + xy_size > limit )
      goto Invalid_Outline;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   delta = 0;
      FT_Byte  f     = *flag;


      if ( f & X_SHORT_VECTOR )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_BYTE( p );
        if ( !( f & X_POSITIVE ) )
          delta = -delta;
      }
      else if ( !( f & SAME_X ) )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_SHORT( p );
      }

      x     += delta;
      vec->x = x;
    }

    /* reading the Y coordinates */

    vec       = gloader->current.outline.points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    y         = 0;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   delta = 0;
      FT_Byte  f     = *flag;


      if ( f & Y_SHORT_VECTOR )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_BYTE( p );
        if ( !( f & Y_POSITIVE ) )
          delta = -delta;
      }
      else if ( !( f & SAME_Y ) )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_SHORT( p );
      }

      y     += delta;
      vec->y = y;

      /* the cast is for stupid compilers */
      *flag  = (FT_Byte)( f & ON_CURVE_POINT );
    }

    outline->n_points   = (FT_Short)n_points;
    outline->n_contours = (FT_Short)n_contours;

    load->cursor = p;

  Fail:
    return error;

  Invalid_Outline:
    error = FT_THROW( Invalid_Outline );
    goto Fail;
  }